

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::tableDecl(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  uint uVar1;
  bool bVar2;
  int iVar3;
  RefAST RVar4;
  NoViableAltException *pNVar5;
  RefAST *child;
  ASTPair currentAST;
  RefAST tmp13_AST;
  RefAST tmp12_AST;
  RefAST tableDecl_AST;
  RefAST tmp11_AST;
  ASTPair local_e8;
  undefined1 local_d0 [16];
  RefCount<AST> local_c0;
  RefCount<AST> local_b8;
  RefCount<Token> local_b0;
  ASTFactory local_a8;
  RefCount<Token> local_98;
  RefToken local_90;
  RefToken local_88;
  RefAST local_80;
  RefAST local_78;
  RefAST local_70;
  RefAST local_68;
  RefAST local_60;
  RefAST local_58;
  RefAST local_50;
  RefAST local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_c0.ref = nullAST.ref;
  local_e8.root.ref = (Ref *)0x0;
  local_e8.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_c0.ref = (Ref *)0x0;
  }
  else {
    uVar1 = (nullAST.ref)->count;
    (nullAST.ref)->count = uVar1 + 1;
    (local_c0.ref)->count = uVar1 + 2;
  }
  local_b8.ref = local_c0.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)(local_d0 + 8),(RefToken *)this_01);
  RefCount<AST>::operator=(&local_b8,(RefCount<AST> *)(local_d0 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_d0 + 8));
  RefCount<Token>::~RefCount(&local_98);
  if (local_b8.ref == (Ref *)0x0) {
    local_80.ref = (Ref *)0x0;
  }
  else {
    (local_b8.ref)->count = (local_b8.ref)->count + 1;
    local_80.ref = local_b8.ref;
  }
  ASTFactory::makeASTRoot(this_01,&local_e8,&local_80);
  RefCount<AST>::~RefCount(&local_80);
  Parser::match((Parser *)this,0xe);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 6) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar3 != 0x10) goto LAB_001899ea;
    tableName(this);
    local_38.ref = this_00->ref;
    if (local_38.ref == (Ref *)0x0) {
      local_38.ref = (Ref *)0x0;
    }
    else {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    child = &local_38;
    ASTFactory::addASTChild(this_01,&local_e8,child);
  }
  else {
LAB_001899ea:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 == 6) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 == 0x17) {
        tableGlyph(this);
        local_40.ref = this_00->ref;
        if (local_40.ref == (Ref *)0x0) {
          local_40.ref = (Ref *)0x0;
        }
        else {
          (local_40.ref)->count = (local_40.ref)->count + 1;
        }
        child = &local_40;
        ASTFactory::addASTChild(this_01,&local_e8,child);
        goto LAB_00189d20;
      }
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 == 6) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 == 0x22) {
        tableFeature(this);
        local_48.ref = this_00->ref;
        if (local_48.ref == (Ref *)0x0) {
          local_48.ref = (Ref *)0x0;
        }
        else {
          (local_48.ref)->count = (local_48.ref)->count + 1;
        }
        child = &local_48;
        ASTFactory::addASTChild(this_01,&local_e8,child);
        goto LAB_00189d20;
      }
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 == 6) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 == 0x23) {
        tableLanguage(this);
        local_50.ref = this_00->ref;
        if (local_50.ref == (Ref *)0x0) {
          local_50.ref = (Ref *)0x0;
        }
        else {
          (local_50.ref)->count = (local_50.ref)->count + 1;
        }
        child = &local_50;
        ASTFactory::addASTChild(this_01,&local_e8,child);
        goto LAB_00189d20;
      }
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 == 6) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 == 0x25) {
        tableSub(this);
        local_58.ref = this_00->ref;
        if (local_58.ref == (Ref *)0x0) {
          local_58.ref = (Ref *)0x0;
        }
        else {
          (local_58.ref)->count = (local_58.ref)->count + 1;
        }
        child = &local_58;
        ASTFactory::addASTChild(this_01,&local_e8,child);
        goto LAB_00189d20;
      }
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 == 6) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 == 0x38) {
        tableJust(this);
        local_60.ref = this_00->ref;
        if (local_60.ref == (Ref *)0x0) {
          local_60.ref = (Ref *)0x0;
        }
        else {
          (local_60.ref)->count = (local_60.ref)->count + 1;
        }
        child = &local_60;
        ASTFactory::addASTChild(this_01,&local_e8,child);
        goto LAB_00189d20;
      }
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 == 6) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 != 0x39) {
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
        if (iVar3 != 0x3a) goto LAB_00189b89;
      }
      tablePos(this);
      local_68.ref = this_00->ref;
      if (local_68.ref == (Ref *)0x0) {
        local_68.ref = (Ref *)0x0;
      }
      else {
        (local_68.ref)->count = (local_68.ref)->count + 1;
      }
      child = &local_68;
      ASTFactory::addASTChild(this_01,&local_e8,child);
    }
    else {
LAB_00189b89:
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar3 == 6) {
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
        if (iVar3 == 0x3b) {
          tableLineBreak(this);
          local_70.ref = this_00->ref;
          if (local_70.ref == (Ref *)0x0) {
            local_70.ref = (Ref *)0x0;
          }
          else {
            (local_70.ref)->count = (local_70.ref)->count + 1;
          }
          child = &local_70;
          ASTFactory::addASTChild(this_01,&local_e8,child);
          goto LAB_00189d20;
        }
      }
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar3 != 6) {
LAB_00189f75:
        pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
        NoViableAltException::NoViableAltException(pNVar5,&local_88);
        __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 != 0xd) goto LAB_00189f75;
      tableOther(this);
      local_78.ref = this_00->ref;
      if (local_78.ref == (Ref *)0x0) {
        local_78.ref = (Ref *)0x0;
      }
      else {
        (local_78.ref)->count = (local_78.ref)->count + 1;
      }
      child = &local_78;
      ASTFactory::addASTChild(this_01,&local_e8,child);
    }
  }
LAB_00189d20:
  RefCount<AST>::~RefCount(child);
  local_d0._8_8_ = nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_d0._8_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a8.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)local_d0,(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)(local_d0 + 8),(RefCount<AST> *)local_d0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_a8.nodeFactory);
  Parser::match((Parser *)this,0xf);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 8) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (bVar2) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar2 = BitSet::member(&_tokenSet_4,iVar3);
      RVar4 = nullAST;
      if (bVar2) {
        if (nullAST.ref == (Ref *)0x0) {
          RVar4.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        local_d0._0_8_ = RVar4.ref;
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b0,this,1);
        ASTFactory::create(&local_a8,(RefToken *)this_01);
        RefCount<AST>::operator=((RefCount<AST> *)local_d0,(RefCount<AST> *)&local_a8);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_a8);
        RefCount<Token>::~RefCount(&local_b0);
        Parser::match((Parser *)this,8);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
        goto LAB_00189e64;
      }
    }
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  bVar2 = BitSet::member(&_tokenSet_4,iVar3);
  if (bVar2) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (bVar2) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar2 = BitSet::member(&_tokenSet_4,iVar3);
      if (bVar2) {
LAB_00189e64:
        RefCount<AST>::operator=(&local_c0,&local_e8.root);
        RefCount<AST>::~RefCount((RefCount<AST> *)(local_d0 + 8));
        RefCount<AST>::~RefCount(&local_b8);
        RefCount<AST>::operator=(this_00,&local_c0);
        RefCount<AST>::~RefCount(&local_c0);
        RefCount<AST>::~RefCount(&local_e8.child);
        RefCount<AST>::~RefCount(&local_e8.root);
        return;
      }
    }
  }
  pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
  NoViableAltException::NoViableAltException(pNVar5,&local_90);
  __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::tableDecl() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableDecl_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp11_AST = nullAST;
		tmp11_AST = astFactory.create(LT(1));
		astFactory.makeASTRoot(currentAST, tmp11_AST);
		match(LITERAL_table);
		{
		if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_name)) {
			tableName();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_glyph)) {
			tableGlyph();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_feature)) {
			tableFeature();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_language)) {
			tableLanguage();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_substitution)) {
			tableSub();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_justification)) {
			tableJust();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_position||LA(2)==LITERAL_positioning)) {
			tablePos();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==LITERAL_linebreak)) {
			tableLineBreak();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==OP_LPAREN) && (LA(2)==IDENT)) {
			tableOther();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		RefAST tmp12_AST = nullAST;
		tmp12_AST = astFactory.create(LT(1));
		match(LITERAL_endtable);
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp13_AST = nullAST;
			tmp13_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_4.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		tableDecl_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_4);
	}
	returnAST = tableDecl_AST;
}